

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O3

bool __thiscall Network::Empty(Network *this)

{
  mutex *__mutex;
  _List_node_base **__mutex_00;
  size_t *psVar1;
  Network *pNVar2;
  uint uVar3;
  int iVar4;
  _Node *p_Var5;
  undefined8 uVar6;
  Message *in_RCX;
  network_address_t extraout_EDX;
  list<MessageAddressed,_std::allocator<MessageAddressed>_> *this_00;
  MessageAddressed MStack_d8;
  mutex *pmStack_40;
  
  __mutex = &this->_mutex;
  uVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (uVar3 == 0) {
    pNVar2 = (Network *)
             (this->_messages).super__List_base<MessageAddressed,_std::allocator<MessageAddressed>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return pNVar2 == this;
  }
  this_00 = (list<MessageAddressed,_std::allocator<MessageAddressed>_> *)(ulong)uVar3;
  std::__throw_system_error(uVar3);
  __mutex_00 = &this_00[2].super__List_base<MessageAddressed,_std::allocator<MessageAddressed>_>.
                _M_impl._M_node.super__List_node_base._M_prev;
  pmStack_40 = __mutex;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex_00);
  if (iVar4 == 0) {
    MStack_d8.dst = extraout_EDX;
    Message::Message(&MStack_d8.msg,in_RCX);
    p_Var5 = std::__cxx11::list<MessageAddressed,_std::allocator<MessageAddressed>_>::
             _M_create_node<MessageAddressed>(this_00,&MStack_d8);
    std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
    psVar1 = &(this_00->super__List_base<MessageAddressed,_std::allocator<MessageAddressed>_>).
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)MStack_d8.msg.m._M_dataplus._M_p != &MStack_d8.msg.m.field_2) {
      operator_delete(MStack_d8.msg.m._M_dataplus._M_p,
                      MStack_d8.msg.m.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)MStack_d8.msg.d._M_dataplus._M_p != &MStack_d8.msg.d.field_2) {
      operator_delete(MStack_d8.msg.d._M_dataplus._M_p,
                      MStack_d8.msg.d.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)MStack_d8.msg.o._M_dataplus._M_p != &MStack_d8.msg.o.field_2) {
      operator_delete(MStack_d8.msg.o._M_dataplus._M_p,
                      MStack_d8.msg.o.field_2._M_allocated_capacity + 1);
    }
    iVar4 = pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
    return SUB41(iVar4,0);
  }
  uVar6 = std::__throw_system_error(iVar4);
  MessageAddressed::~MessageAddressed(&MStack_d8);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
  _Unwind_Resume(uVar6);
}

Assistant:

bool Network::Empty(){
    std::lock_guard<std::mutex> guard(_mutex);//互斥锁，保证多线程情况下只有一个在运行。
    return _messages.empty();
}